

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_flattened_io_block_struct
          (CompilerGLSL *this,string *basename,SPIRType *type,char *qual,
          SmallVector<unsigned_int,_8UL> *indices)

{
  char *pcVar1;
  size_t sVar2;
  uint *puVar3;
  SPIRType *pSVar4;
  SPIRType *pSVar5;
  runtime_error *this_00;
  ulong uVar6;
  long lVar7;
  SmallVector<unsigned_int,_8UL> sub_indices;
  SmallVector<unsigned_int,_8UL> local_68;
  
  local_68.super_VectorView<unsigned_int>.ptr = (uint *)&local_68.stack_storage;
  local_68.super_VectorView<unsigned_int>.buffer_size = 0;
  local_68.buffer_capacity = 8;
  SmallVector<unsigned_int,_8UL>::operator=(&local_68,indices);
  SmallVector<unsigned_int,_8UL>::reserve
            (&local_68,local_68.super_VectorView<unsigned_int>.buffer_size + 1);
  pcVar1 = (char *)local_68.super_VectorView<unsigned_int>.ptr +
           local_68.super_VectorView<unsigned_int>.buffer_size * 4;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  local_68.super_VectorView<unsigned_int>.buffer_size =
       local_68.super_VectorView<unsigned_int>.buffer_size + 1;
  sVar2 = (indices->super_VectorView<unsigned_int>).buffer_size;
  pSVar4 = type;
  if (sVar2 != 0) {
    puVar3 = (indices->super_VectorView<unsigned_int>).ptr;
    lVar7 = 0;
    do {
      pSVar4 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (pSVar4->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                          [*(uint *)((long)puVar3 + lVar7)].id);
      lVar7 = lVar7 + 4;
    } while (sVar2 << 2 != lVar7);
  }
  if (pSVar4->basetype == Struct) {
    if ((pSVar4->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      if ((int)(pSVar4->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
               .buffer_size != 0) {
        uVar6 = 0;
        do {
          *(int *)((char *)local_68.super_VectorView<unsigned_int>.ptr +
                  local_68.super_VectorView<unsigned_int>.buffer_size * 4 + -4) = (int)uVar6;
          pSVar5 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                              ptr + (pSVar4->member_types).
                                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                    ptr[uVar6].id);
          if (pSVar5->basetype == Struct) {
            emit_flattened_io_block_struct(this,basename,type,qual,&local_68);
          }
          else {
            emit_flattened_io_block_member(this,basename,type,qual,&local_68);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < (uint)(pSVar4->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                               buffer_size);
      }
      local_68.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)local_68.super_VectorView<unsigned_int>.ptr !=
          &local_68.stack_storage) {
        free(local_68.super_VectorView<unsigned_int>.ptr);
      }
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"Cannot flatten array of structs in I/O blocks.");
    *(undefined ***)this_00 = &PTR__runtime_error_0035fca8;
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  __assert_fail("member_type->basetype == SPIRType::Struct",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                ,0xa5a,
                "void spirv_cross::CompilerGLSL::emit_flattened_io_block_struct(const std::string &, const SPIRType &, const char *, const SmallVector<uint32_t> &)"
               );
}

Assistant:

void CompilerGLSL::emit_flattened_io_block_struct(const std::string &basename, const SPIRType &type, const char *qual,
                                                  const SmallVector<uint32_t> &indices)
{
	auto sub_indices = indices;
	sub_indices.push_back(0);

	const SPIRType *member_type = &type;
	for (auto &index : indices)
		member_type = &get<SPIRType>(member_type->member_types[index]);

	assert(member_type->basetype == SPIRType::Struct);

	if (!member_type->array.empty())
		SPIRV_CROSS_THROW("Cannot flatten array of structs in I/O blocks.");

	for (uint32_t i = 0; i < uint32_t(member_type->member_types.size()); i++)
	{
		sub_indices.back() = i;
		if (get<SPIRType>(member_type->member_types[i]).basetype == SPIRType::Struct)
			emit_flattened_io_block_struct(basename, type, qual, sub_indices);
		else
			emit_flattened_io_block_member(basename, type, qual, sub_indices);
	}
}